

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimhelpers.cpp
# Opt level: O0

void msg(int32_t level,char *m,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 auStack_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (in_EDI <= verbosity) {
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    local_10 = in_RSI;
    local_4 = in_EDI;
    printf("[btorsim] ");
    local_20 = &stack0x00000008;
    local_24 = 0x30;
    local_28 = 0x10;
    local_18 = auStack_d8;
    vprintf(local_10,&local_28);
    printf("\n");
  }
  return;
}

Assistant:

void
msg (int32_t level, const char *m, ...)
{
  if (level > verbosity) return;
  assert (m);
  printf ("[btorsim] ");
  va_list ap;
  va_start (ap, m);
  vprintf (m, ap);
  va_end (ap);
  printf ("\n");
}